

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::
basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::before_value(basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
               *this,uint8_t code)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer psVar1;
  unsigned_long __val;
  assertion_error *this_01;
  allocator<char> local_3a;
  uint8_t code_local;
  string name;
  
  psVar1 = (this->stack_).
           super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  code_local = code;
  if ((this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar1) {
    this_00 = &this->buffer_;
    if (psVar1[-1].type_ == document) {
      (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[psVar1[-1].name_offset_] = code;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(this_00,&code_local);
      psVar1 = (this->stack_).
               super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __val = psVar1[-1].index_;
      psVar1[-1].index_ = __val + 1;
      std::__cxx11::to_string(&name,__val);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
                 (const_iterator)
                 (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )name._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(name._M_dataplus._M_p + name._M_string_length));
      local_3a = (allocator<char>)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (this_00,(uchar *)&local_3a);
      std::__cxx11::string::~string((string *)&name);
    }
    return;
  }
  this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"assertion \'!stack_.empty()\' failed at  <> :0",&local_3a);
  assertion_error::assertion_error(this_01,&name);
  __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void before_value(uint8_t code) 
    {
        JSONCONS_ASSERT(!stack_.empty());
        if (stack_.back().is_object())
        {
            buffer_[stack_.back().member_offset()] = code;
        }
        else
        {
            buffer_.push_back(code);
            std::string name = std::to_string(stack_.back().next_index());
            buffer_.insert(buffer_.end(), name.begin(), name.end());
            buffer_.push_back(0x00);
        }
    }